

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O2

void __thiscall
fasttext::QuantMatrix::averageRowsToVector
          (QuantMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  long lVar1;
  long lVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  
  Vector::zero(x);
  puVar3 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  lVar1 = -(long)puVar3;
  for (; puVar3 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    (*(this->super_Matrix)._vptr_Matrix[4])(this,x,(ulong)*puVar3);
    lVar1 = lVar1 + -4;
  }
  lVar1 = -(lVar1 + (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start);
  lVar2 = lVar1 >> 2;
  auVar4._8_4_ = (int)(lVar1 >> 0x22);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  Vector::mul(x,(float)(1.0 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0))));
  return;
}

Assistant:

void QuantMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}